

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelTransformers.cpp
# Opt level: O0

void iDynTree::reducedModelAddSolidShapes
               (Model *fullModel,Model *reducedModel,string *linkInReducedModel,
               Traversal *linkSubModel,FreeFloatingPos *pos,LinkPositions *subModelBase_X_link)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Transform *pTVar4;
  ModelSolidShapes *pMVar5;
  vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_> *this;
  const_reference pvVar6;
  vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_> *pvVar7;
  const_reference ppSVar8;
  undefined4 extraout_var;
  vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
  *pvVar9;
  SolidShape *pSVar10;
  undefined4 extraout_var_00;
  Model *in_RSI;
  Model *in_RDI;
  Transform visitedLink_H_shape_1;
  SolidShape *copiedShape_1;
  int shapeIdx_1;
  vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
  *collisionSolidShapes;
  Transform visitedLink_H_shape;
  SolidShape *copiedShape;
  int shapeIdx;
  vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
  *visualSolidShapes;
  Transform subModelBase_H_visitedLink;
  LinkIndex visitedLinkIndex;
  LinkConstPtr parentLink;
  LinkConstPtr visitedLink;
  uint traversalEl;
  LinkIndex subModelBaseIndexInReducedModel;
  Transform *in_stack_fffffffffffffd68;
  SolidShape *in_stack_fffffffffffffd70;
  value_type *in_stack_fffffffffffffd78;
  Transform local_268 [72];
  string *in_stack_fffffffffffffde0;
  Model *in_stack_fffffffffffffde8;
  Transform local_208 [96];
  Transform *local_1a8;
  int local_19c;
  vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
  *local_198;
  Transform local_190 [96];
  Transform local_130 [96];
  value_type *local_d0;
  int local_c4;
  vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
  *local_c0;
  Transform local_b8 [96];
  size_type local_58;
  Link *local_50;
  Link *local_48;
  uint local_3c;
  size_type local_38;
  Model *local_10;
  Model *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_38 = Model::getLinkIndex(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  local_3c = 0;
  while( true ) {
    uVar1 = local_3c;
    uVar2 = Traversal::getNrOfVisitedLinks((Traversal *)0x4594ec);
    if (uVar2 <= uVar1) break;
    local_48 = Traversal::getLink((Traversal *)in_stack_fffffffffffffd70,
                                  (TraversalIndex)in_stack_fffffffffffffd68);
    local_50 = Traversal::getParentLink
                         ((Traversal *)in_stack_fffffffffffffd70,
                          (TraversalIndex)in_stack_fffffffffffffd68);
    local_58 = Link::getIndex(local_48);
    pTVar4 = LinkPositions::operator()
                       ((LinkPositions *)in_stack_fffffffffffffd70,
                        (LinkIndex)in_stack_fffffffffffffd68);
    iDynTree::Transform::Transform(local_b8,pTVar4);
    pMVar5 = Model::visualSolidShapes(local_8);
    local_c0 = ModelSolidShapes::getLinkSolidShapes(pMVar5);
    local_c4 = 0;
    while( true ) {
      this = (vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_> *)
             (long)local_c4;
      pvVar6 = std::
               vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
               ::operator[](local_c0,local_58);
      pvVar7 = (vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_> *)
               std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>::size
                         (pvVar6);
      if (pvVar7 <= this) break;
      pvVar6 = std::
               vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
               ::operator[](local_c0,local_58);
      ppSVar8 = std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>::
                operator[](pvVar6,(long)local_c4);
      iVar3 = (*(*ppSVar8)->_vptr_SolidShape[2])();
      local_d0 = (value_type *)CONCAT44(extraout_var,iVar3);
      pvVar6 = std::
               vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
               ::operator[](local_c0,local_58);
      ppSVar8 = std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>::
                operator[](pvVar6,(long)local_c4);
      pTVar4 = SolidShape::getLink_H_geometry(*ppSVar8);
      iDynTree::Transform::Transform(local_130,pTVar4);
      in_stack_fffffffffffffd78 = local_d0;
      iDynTree::Transform::operator*(local_190,local_b8);
      SolidShape::setLink_H_geometry(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      pMVar5 = Model::visualSolidShapes(local_10);
      pvVar9 = ModelSolidShapes::getLinkSolidShapes(pMVar5);
      std::
      vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
      ::operator[](pvVar9,local_38);
      std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>::push_back
                (this,in_stack_fffffffffffffd78);
      local_c4 = local_c4 + 1;
    }
    pMVar5 = Model::collisionSolidShapes(local_8);
    local_198 = ModelSolidShapes::getLinkSolidShapes(pMVar5);
    local_19c = 0;
    while( true ) {
      in_stack_fffffffffffffd70 = (SolidShape *)(long)local_19c;
      pvVar6 = std::
               vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
               ::operator[](local_198,local_58);
      pSVar10 = (SolidShape *)
                std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>::size
                          (pvVar6);
      if (pSVar10 <= in_stack_fffffffffffffd70) break;
      pvVar6 = std::
               vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
               ::operator[](local_198,local_58);
      ppSVar8 = std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>::
                operator[](pvVar6,(long)local_19c);
      iVar3 = (*(*ppSVar8)->_vptr_SolidShape[2])();
      local_1a8 = (Transform *)CONCAT44(extraout_var_00,iVar3);
      pvVar6 = std::
               vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
               ::operator[](local_198,local_58);
      ppSVar8 = std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>::
                operator[](pvVar6,(long)local_19c);
      pTVar4 = SolidShape::getLink_H_geometry(*ppSVar8);
      iDynTree::Transform::Transform(local_208,pTVar4);
      in_stack_fffffffffffffd68 = local_1a8;
      iDynTree::Transform::operator*(local_268,local_b8);
      SolidShape::setLink_H_geometry(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      pMVar5 = Model::collisionSolidShapes(local_10);
      pvVar9 = ModelSolidShapes::getLinkSolidShapes(pMVar5);
      std::
      vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
      ::operator[](pvVar9,local_38);
      std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>::push_back
                (this,in_stack_fffffffffffffd78);
      local_19c = local_19c + 1;
    }
    local_3c = local_3c + 1;
  }
  return;
}

Assistant:

void reducedModelAddSolidShapes(const Model& fullModel,
                                      Model& reducedModel,
                                const std::string linkInReducedModel,
                                const Traversal& linkSubModel,
                                const FreeFloatingPos& pos,
                                const LinkPositions& subModelBase_X_link)
{
    LinkIndex subModelBaseIndexInReducedModel = reducedModel.getLinkIndex(linkInReducedModel);

    // All the geometries collected in the traversal are lumped into the base link
    for(unsigned int traversalEl=0; traversalEl < linkSubModel.getNrOfVisitedLinks(); traversalEl++)
    {
        LinkConstPtr visitedLink = linkSubModel.getLink(traversalEl);
        LinkConstPtr parentLink  = linkSubModel.getParentLink(traversalEl);

        LinkIndex visitedLinkIndex = visitedLink->getIndex();
        Transform subModelBase_H_visitedLink     = subModelBase_X_link(visitedLinkIndex);

        // Add visual shapes to the new lumped link, i.e. the subModelBase
        auto& visualSolidShapes = fullModel.visualSolidShapes().getLinkSolidShapes();
        for(int shapeIdx=0; shapeIdx < visualSolidShapes[visitedLinkIndex].size(); shapeIdx++)
        {
            // Clone the shape
            SolidShape * copiedShape = visualSolidShapes[visitedLinkIndex][shapeIdx]->clone();

            // Update shape transform from the old link to the new link
            Transform visitedLink_H_shape = visualSolidShapes[visitedLinkIndex][shapeIdx]->getLink_H_geometry();
            copiedShape->setLink_H_geometry(subModelBase_H_visitedLink * visitedLink_H_shape);

            // Ownership of the new pointer is transfered to the ModelSolidShapes class
            // (it will be eventually deleted by the close() method
            reducedModel.visualSolidShapes().getLinkSolidShapes()[subModelBaseIndexInReducedModel].push_back(copiedShape);
        }

        // Add collision shapes to the new lumped link, i.e. the subModelBase
        auto& collisionSolidShapes = fullModel.collisionSolidShapes().getLinkSolidShapes();
        for(int shapeIdx=0; shapeIdx < collisionSolidShapes[visitedLinkIndex].size(); shapeIdx++)
        {
            // Clone the shape : ownership of the new pointer is transfered to the ModelSolidShapes class
            // (it will be eventually deleted by the close() method
            SolidShape * copiedShape = collisionSolidShapes[visitedLinkIndex][shapeIdx]->clone();

            // Update shape transform from the old link to the new link
            Transform visitedLink_H_shape = collisionSolidShapes[visitedLinkIndex][shapeIdx]->getLink_H_geometry();
            copiedShape->setLink_H_geometry(subModelBase_H_visitedLink*visitedLink_H_shape);

            // Ownership of the new pointer is transfered to the ModelSolidShapes class
            // (it will be eventually deleted by the close() method
            reducedModel.collisionSolidShapes().getLinkSolidShapes()[subModelBaseIndexInReducedModel].push_back(copiedShape);
        }
    }

}